

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void R_ShutdownRenderer(void)

{
  R_DeinitSprites();
  R_DeinitPlanes();
  if (openings != (short *)0x0) {
    M_Free(openings);
    openings = (short *)0x0;
  }
  if (drawsegs != (drawseg_t *)0x0) {
    M_Free(drawsegs);
    drawsegs = (drawseg_t *)0x0;
  }
  return;
}

Assistant:

static void R_ShutdownRenderer()
{
	R_DeinitSprites();
	R_DeinitPlanes();
	// Free openings
	if (openings != NULL)
	{
		M_Free (openings);
		openings = NULL;
	}

	// Free drawsegs
	if (drawsegs != NULL)
	{
		M_Free (drawsegs);
		drawsegs = NULL;
	}
}